

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool __thiscall cfd::core::Privkey::IsValid(Privkey *this)

{
  bool bVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,&this->data_
                    );
  bVar1 = IsValid((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return bVar1;
}

Assistant:

bool Privkey::IsValid() const { return IsValid(data_.GetBytes()); }